

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_attribute
               (Context *ctx,RegisterType regtype,int regnum,MOJOSHADER_usage usage,int index,
               int wmask,int flags)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  undefined4 in_register_00000084;
  char var [64];
  char local_38 [16];
  
  get_METAL_varname_in_buf(ctx,regtype,regnum,var,CONCAT44(in_register_00000084,index));
  if (index != 0) {
    snprintf(local_38,0x10,"%u",(ulong)(uint)index);
  }
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    if ((flags & 4U) != 0) {
      failf(ctx,"centroid unsupported in %s profile",ctx->profile->name);
      return;
    }
    if ((regtype & ~REG_TYPE_INPUT) != REG_TYPE_COLOROUT) {
      if ((REG_TYPE_MISCTYPE < regtype) ||
         ((0x2000aU >> (regtype & (REG_TYPE_TEMPFLOAT16|REG_TYPE_LOOP)) & 1) == 0)) {
        pcVar4 = "unknown pixel shader attribute register";
        goto LAB_0010cd58;
      }
      push_output(ctx,&ctx->inputs);
      sVar2 = buffer_size(ctx->inputs);
      if (sVar2 == 0) {
        output_line(ctx,"struct %s_Input",ctx->mainfn);
        output_line(ctx,"{");
      }
      ctx->indent = ctx->indent + 1;
      if (regtype == REG_TYPE_MISCTYPE) {
        if (regnum == 0) {
          pcVar4 = "float4 %s [[position]];";
        }
        else {
          if (regnum != 1) {
            fail(ctx,"BUG: unhandled misc register");
            goto LAB_0010d060;
          }
          pcVar4 = "bool %s [[front_facing]];";
        }
LAB_0010d053:
        output_line(ctx,pcVar4,var);
LAB_0010d060:
        pop_output(ctx);
      }
      else {
        if (usage == MOJOSHADER_USAGE_FOG) {
          pcVar4 = "float4 %s [[user(fog)]];";
          goto LAB_0010d053;
        }
        if (usage == MOJOSHADER_USAGE_COLOR) {
          output_line(ctx,"float4 %s [[user(color%d)]];",var,(ulong)(uint)index);
          goto LAB_0010d060;
        }
        if (usage != MOJOSHADER_USAGE_TEXCOORD) goto LAB_0010d060;
        iVar1 = shader_version_atleast(ctx,'\x01','\x04');
        output_line(ctx,"float4 %s [[user(texcoord%d)]];",var,(ulong)(uint)index);
        pop_output(ctx);
        if (iVar1 == 0) {
          return;
        }
      }
      push_output(ctx,&ctx->mainline_top);
      ctx->indent = ctx->indent + 1;
      pcVar4 = "#define %s input.%s";
      goto LAB_0010d087;
    }
    push_output(ctx,&ctx->outputs);
    sVar2 = buffer_size(ctx->outputs);
    if (sVar2 == 0) {
      output_line(ctx,"struct %s_Output",ctx->mainfn);
      output_line(ctx,"{");
    }
    ctx->indent = ctx->indent + 1;
    if (regtype != REG_TYPE_COLOROUT) {
      pcVar4 = "float %s [[depth(any)]];";
      goto LAB_0010cfda;
    }
    pcVar4 = "float4 %s [[color(%d)]];";
    uVar3 = (ulong)(uint)regnum;
    goto LAB_0010cfca;
  }
  if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
    pcVar4 = "Unknown shader type";
    goto LAB_0010cd58;
  }
  iVar1 = shader_version_atleast(ctx,'\x03','\0');
  if (iVar1 != 0) {
    if (regtype == REG_TYPE_OUTPUT) goto LAB_0010cf37;
    if (regtype != REG_TYPE_INPUT) goto switchD_0010cda0_caseD_2;
switchD_0010cda0_caseD_1:
    push_output(ctx,&ctx->inputs);
    sVar2 = buffer_size(ctx->inputs);
    if (sVar2 == 0) {
      output_line(ctx,"struct %s_Input",ctx->mainfn);
      output_line(ctx,"{");
    }
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"float4 %s [[attribute(%d)]];",var,(ulong)(uint)regnum);
    pop_output(ctx);
    push_output(ctx,&ctx->mainline_top);
    ctx->indent = ctx->indent + 1;
    pcVar4 = "#define %s input.%s";
    goto LAB_0010d087;
  }
  index = regnum;
  switch(regtype) {
  case REG_TYPE_INPUT:
    goto switchD_0010cda0_caseD_1;
  default:
switchD_0010cda0_caseD_2:
    pcVar4 = "unknown vertex shader attribute register";
LAB_0010cd58:
    fail(ctx,pcVar4);
    return;
  case REG_TYPE_RASTOUT:
    if ((uint)regnum < 3) {
      usage = *(MOJOSHADER_usage *)(&DAT_001253f0 + (ulong)(uint)regnum * 4);
    }
    break;
  case REG_TYPE_ATTROUT:
    usage = MOJOSHADER_USAGE_COLOR;
    break;
  case REG_TYPE_OUTPUT:
    usage = MOJOSHADER_USAGE_TEXCOORD;
  }
LAB_0010cf37:
  push_output(ctx,&ctx->outputs);
  sVar2 = buffer_size(ctx->outputs);
  if (sVar2 == 0) {
    output_line(ctx,"struct %s_Output",ctx->mainfn);
    output_line(ctx,"{");
  }
  ctx->indent = ctx->indent + 1;
  switch(usage) {
  case MOJOSHADER_USAGE_POSITION:
    pcVar4 = "float4 %s [[position]];";
    break;
  default:
    goto switchD_0010cf9d_caseD_1;
  case MOJOSHADER_USAGE_POINTSIZE:
    pcVar4 = "float4 %s [[point_size]];";
    break;
  case MOJOSHADER_USAGE_TEXCOORD:
    pcVar4 = "float4 %s [[user(texcoord%d)]];";
    goto LAB_0010cfc1;
  case MOJOSHADER_USAGE_COLOR:
    pcVar4 = "float4 %s [[user(color%d)]];";
LAB_0010cfc1:
    uVar3 = (ulong)(uint)index;
LAB_0010cfca:
    output_line(ctx,pcVar4,var,uVar3);
    goto switchD_0010cf9d_caseD_1;
  case MOJOSHADER_USAGE_FOG:
    pcVar4 = "float4 %s [[user(fog)]];";
  }
LAB_0010cfda:
  output_line(ctx,pcVar4,var);
switchD_0010cf9d_caseD_1:
  pop_output(ctx);
  push_output(ctx,&ctx->mainline_top);
  ctx->indent = ctx->indent + 1;
  pcVar4 = "#define %s output.%s";
LAB_0010d087:
  output_line(ctx,pcVar4,var,var);
  pop_output(ctx);
  push_output(ctx,&ctx->mainline);
  ctx->indent = ctx->indent + 1;
  output_line(ctx,"#undef %s",var);
  pop_output(ctx);
  return;
}

Assistant:

static void emit_METAL_attribute(Context *ctx, RegisterType regtype, int regnum,
                                MOJOSHADER_usage usage, int index, int wmask,
                                int flags)
{
    // !!! FIXME: this function doesn't deal with write masks at all yet!
    const char *usage_str = NULL;
    char index_str[16] = { '\0' };
    char var[64];

    get_METAL_varname_in_buf(ctx, regtype, regnum, var, sizeof (var));

    //assert((flags & MOD_PP) == 0);  // !!! FIXME: is PP allowed?

    if (index != 0)  // !!! FIXME: a lot of these MUST be zero.
        snprintf(index_str, sizeof (index_str), "%u", (uint) index);

    if (shader_is_vertex(ctx))
    {
        // pre-vs3 output registers.
        // these don't ever happen in DCL opcodes, I think. Map to vs_3_*
        //  output registers.
        if (!shader_version_atleast(ctx, 3, 0))
        {
            if (regtype == REG_TYPE_RASTOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                index = regnum;
                switch ((const RastOutType) regnum)
                {
                    case RASTOUT_TYPE_POSITION:
                        usage = MOJOSHADER_USAGE_POSITION;
                        break;
                    case RASTOUT_TYPE_FOG:
                        usage = MOJOSHADER_USAGE_FOG;
                        break;
                    case RASTOUT_TYPE_POINT_SIZE:
                        usage = MOJOSHADER_USAGE_POINTSIZE;
                        break;
                } // switch
            } // if

            else if (regtype == REG_TYPE_ATTROUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_COLOR;
                index = regnum;
            } // else if

            else if (regtype == REG_TYPE_TEXCRDOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_TEXCOORD;
                index = regnum;
            } // else if
        } // if

        if (regtype == REG_TYPE_INPUT)
        {
            push_output(ctx, &ctx->inputs);
            if (buffer_size(ctx->inputs) == 0)
            {
                output_line(ctx, "struct %s_Input", ctx->mainfn);
                output_line(ctx, "{");
            } // if

            ctx->indent++;
            output_line(ctx, "float4 %s [[attribute(%d)]];", var, regnum);
            pop_output(ctx);

            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            // !!! FIXME: might trigger unused var warnings in Clang.
            //output_line(ctx, "constant float4 &%s = input.%s;", var, var);
            output_line(ctx, "#define %s input.%s", var, var);
            pop_output(ctx);
            push_output(ctx, &ctx->mainline);
            ctx->indent++;
            output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
            pop_output(ctx);
        } // if

        else if (regtype == REG_TYPE_OUTPUT)
        {
            push_output(ctx, &ctx->outputs);
            if (buffer_size(ctx->outputs) == 0)
            {
                output_line(ctx, "struct %s_Output", ctx->mainfn);
                output_line(ctx, "{");
            } // if

            ctx->indent++;

            switch (usage)
            {
                case MOJOSHADER_USAGE_POSITION:
                    output_line(ctx, "float4 %s [[position]];", var);
                    break;
                case MOJOSHADER_USAGE_POINTSIZE:
                    output_line(ctx, "float4 %s [[point_size]];", var);
                    break;
                case MOJOSHADER_USAGE_COLOR:
                    output_line(ctx, "float4 %s [[user(color%d)]];", var, index);
                    break;
                case MOJOSHADER_USAGE_FOG:
                    output_line(ctx, "float4 %s [[user(fog)]];", var);
                    break;
                case MOJOSHADER_USAGE_TEXCOORD:
                    output_line(ctx, "float4 %s [[user(texcoord%d)]];", var, index);
                    break;
                default:
                    // !!! FIXME: we need to deal with some more built-in varyings here.
                    break;
            } // switch

            pop_output(ctx);

            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            // !!! FIXME: this doesn't work.
            //output_line(ctx, "float4 &%s = output.%s;", var, var);
            output_line(ctx, "#define %s output.%s", var, var);
            pop_output(ctx);
            push_output(ctx, &ctx->mainline);
            ctx->indent++;
            output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
            pop_output(ctx);
        } // else if

        else
        {
            fail(ctx, "unknown vertex shader attribute register");
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        // samplers DCLs get handled in emit_METAL_sampler().

        if (flags & MOD_CENTROID)  // !!! FIXME
        {
            failf(ctx, "centroid unsupported in %s profile", ctx->profile->name);
            return;
        } // if

        if ((regtype == REG_TYPE_COLOROUT) || (regtype == REG_TYPE_DEPTHOUT))
        {
            push_output(ctx, &ctx->outputs);
            if (buffer_size(ctx->outputs) == 0)
            {
                output_line(ctx, "struct %s_Output", ctx->mainfn);
                output_line(ctx, "{");
            } // if
            ctx->indent++;

            if (regtype == REG_TYPE_COLOROUT)
                output_line(ctx, "float4 %s [[color(%d)]];", var, regnum);
            else if (regtype == REG_TYPE_DEPTHOUT)
                output_line(ctx, "float %s [[depth(any)]];", var);

            pop_output(ctx);

            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            // !!! FIXME: this doesn't work.
            //output_line(ctx, "float%s &%s = output.%s;", (regtype == REG_TYPE_DEPTHOUT) ? "" : "4", var, var);
            output_line(ctx, "#define %s output.%s", var, var);
            pop_output(ctx);
            push_output(ctx, &ctx->mainline);
            ctx->indent++;
            output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
            pop_output(ctx);
        } // if

        // !!! FIXME: can you actualy have a texture register with COLOR usage?
        else if ((regtype == REG_TYPE_TEXTURE) ||
                 (regtype == REG_TYPE_INPUT) ||
                 (regtype == REG_TYPE_MISCTYPE))
        {
            int skipreference = 0;
            push_output(ctx, &ctx->inputs);
            if (buffer_size(ctx->inputs) == 0)
            {
                output_line(ctx, "struct %s_Input", ctx->mainfn);
                output_line(ctx, "{");
            } // if
            ctx->indent++;

            if (regtype == REG_TYPE_MISCTYPE)
            {
                const MiscTypeType mt = (MiscTypeType) regnum;
                if (mt == MISCTYPE_TYPE_FACE)
                    output_line(ctx, "bool %s [[front_facing]];", var);
                else if (mt == MISCTYPE_TYPE_POSITION)
                    output_line(ctx, "float4 %s [[position]];", var);
                else
                    fail(ctx, "BUG: unhandled misc register");
            } // else if

            else
            {
                if (usage == MOJOSHADER_USAGE_TEXCOORD)
                {
                    // ps_1_1 does a different hack for this attribute.
                    //  Refer to emit_METAL_global()'s REG_TYPE_ADDRESS code.
                    if (!shader_version_atleast(ctx, 1, 4))
                        skipreference = 1;
                    output_line(ctx, "float4 %s [[user(texcoord%d)]];", var, index);
                } // if

                else if (usage == MOJOSHADER_USAGE_COLOR)
                    output_line(ctx, "float4 %s [[user(color%d)]];", var, index);

                else if (usage == MOJOSHADER_USAGE_FOG)
                    output_line(ctx, "float4 %s [[user(fog)]];", var);
            } // else

            pop_output(ctx);

            // !!! FIXME: can cause unused var warnings in Clang...
            #if 0
            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            if ((regtype == REG_TYPE_MISCTYPE)&&(regnum == MISCTYPE_TYPE_FACE))
                output_line(ctx, "constant bool &%s = input.%s;", var, var);
            else if (!skipreference)
                output_line(ctx, "constant float4 &%s = input.%s;", var, var);
            pop_output(ctx);
            #endif

            if (!skipreference)
            {
                push_output(ctx, &ctx->mainline_top);
                ctx->indent++;
                output_line(ctx, "#define %s input.%s", var, var);
                pop_output(ctx);
                push_output(ctx, &ctx->mainline);
                ctx->indent++;
                output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
                pop_output(ctx);
            } // if
        } // else if

        else
        {
            fail(ctx, "unknown pixel shader attribute register");
        } // else
    } // else if

    else
    {
        fail(ctx, "Unknown shader type");  // state machine should catch this.
    } // else
}